

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O2

long __thiscall
JsUtil::Stack<long,_Memory::HeapAllocator,_false,_DefaultComparer>::Pop
          (Stack<long,_Memory::HeapAllocator,_false,_DefaultComparer> *this)

{
  Type TVar1;
  Type *pTVar2;
  
  pTVar2 = List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Item
                     (&this->list,
                      (this->list).super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>.
                      count + -1);
  TVar1 = *pTVar2;
  List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::RemoveAt
            (&this->list,
             (this->list).super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>.count +
             -1);
  return TVar1;
}

Assistant:

T Pop()
        {
            T item = list.Item(list.Count() - 1);
            list.RemoveAt(list.Count() - 1);
            return item;
        }